

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogt_voxel_meshify.h
# Opt level: O2

void ogt_mesh_smooth_normals(ogt_voxel_meshify_context *ctx,ogt_mesh *mesh)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  uint uVar8;
  ogt_mesh_vertex *poVar9;
  uint32_t *puVar10;
  int iVar11;
  uint32_t uVar12;
  int iVar13;
  int iVar14;
  void *__s;
  void *pvVar15;
  uint uVar16;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar17;
  long lVar18;
  uint uVar19;
  ogt_mesh_vertex *__s1;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  uint32_t i;
  float fVar24;
  float fVar25;
  float fVar26;
  ogt_mesh_vec3 oVar27;
  ogt_mesh_vec3 local_60;
  ogt_mesh_vec3 local_50;
  ogt_mesh_vec3 local_40;
  
  __s = _voxel_meshify_malloc(ctx,(ulong)mesh->vertex_count << 2);
  memset(__s,0xff,(ulong)mesh->vertex_count << 2);
  uVar19 = 1;
  do {
    uVar16 = uVar19;
    uVar19 = uVar16 * 2;
  } while (uVar16 < mesh->vertex_count);
  pvVar15 = _voxel_meshify_malloc(ctx,(ulong)uVar16 << 2);
  memset(pvVar15,0xff,(ulong)uVar16 << 2);
  uVar20 = 0;
  iVar11 = 0;
  uVar17 = extraout_RDX;
  do {
    if (mesh->vertex_count <= uVar20) {
      _voxel_meshify_free(ctx,pvVar15);
      pvVar15 = _voxel_meshify_malloc(ctx,(ulong)mesh->vertex_count * 0xc);
      memset(pvVar15,0,(ulong)mesh->vertex_count * 0xc);
      for (uVar19 = 0; uVar19 < mesh->index_count; uVar19 = uVar19 + 3) {
        poVar9 = mesh->vertices;
        puVar10 = mesh->indices;
        uVar23 = (ulong)puVar10[uVar19];
        uVar22 = (ulong)puVar10[uVar19 + 1];
        uVar20 = (ulong)puVar10[uVar19 + 2];
        local_60.z = poVar9[uVar23].pos.z;
        uVar2 = poVar9[uVar23].pos.x;
        uVar5 = poVar9[uVar23].pos.y;
        uVar3 = poVar9[uVar22].pos.x;
        uVar6 = poVar9[uVar22].pos.y;
        local_50.x = (float)uVar3 - (float)uVar2;
        local_50.y = (float)uVar6 - (float)uVar5;
        local_50.z = poVar9[uVar22].pos.z - local_60.z;
        uVar4 = poVar9[uVar20].pos.x;
        uVar7 = poVar9[uVar20].pos.y;
        local_60.x = (float)uVar4 - (float)uVar2;
        local_60.y = (float)uVar7 - (float)uVar5;
        local_60.z = poVar9[uVar20].pos.z - local_60.z;
        local_40 = _cross3(&local_50,&local_60);
        uVar16 = *(uint *)((long)__s + uVar22 * 4);
        uVar8 = *(uint *)((long)__s + uVar20 * 4);
        lVar21 = (ulong)*(uint *)((long)__s + uVar23 * 4) * 0xc;
        oVar27 = _add3((ogt_mesh_vec3 *)((long)pvVar15 + lVar21),&local_40);
        *(long *)((long)pvVar15 + lVar21) = oVar27._0_8_;
        *(float *)((long)pvVar15 + lVar21 + 8) = oVar27.z;
        lVar21 = (ulong)uVar16 * 0xc;
        oVar27 = _add3((ogt_mesh_vec3 *)((long)pvVar15 + lVar21),&local_40);
        *(long *)((long)pvVar15 + lVar21) = oVar27._0_8_;
        *(float *)((long)pvVar15 + lVar21 + 8) = oVar27.z;
        lVar21 = (ulong)uVar8 * 0xc;
        oVar27 = _add3((ogt_mesh_vec3 *)((long)pvVar15 + lVar21),&local_40);
        *(long *)((long)pvVar15 + lVar21) = oVar27._0_8_;
        *(float *)((long)pvVar15 + lVar21 + 8) = oVar27.z;
      }
      lVar21 = 5;
      uVar20 = 0;
      do {
        if (mesh->vertex_count <= uVar20) {
          _voxel_meshify_free(ctx,pvVar15);
          _voxel_meshify_free(ctx,__s);
          return;
        }
        lVar18 = (ulong)*(uint *)((long)__s + uVar20 * 4) * 0xc;
        uVar17 = *(undefined8 *)((long)pvVar15 + lVar18);
        fVar1 = *(float *)((long)pvVar15 + lVar18 + 8);
        fVar24 = (float)uVar17;
        fVar25 = (float)((ulong)uVar17 >> 0x20);
        fVar26 = fVar1 * fVar1 + fVar24 * fVar24 + fVar25 * fVar25;
        if (0.001 < fVar26) {
          fVar26 = SQRT(fVar26);
          if (fVar26 <= 0.0) {
            __assert_fail("len > 0.0f",
                          "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_voxel_meshify.h"
                          ,0x127,"ogt_mesh_vec3 _normalize3(const ogt_mesh_vec3 &)");
          }
          fVar26 = 1.0 / fVar26;
          poVar9 = mesh->vertices;
          *(ulong *)((long)poVar9 + lVar21 * 4 + -8) = CONCAT44(fVar25 * fVar26,fVar24 * fVar26);
          (&(poVar9->pos).x)[lVar21] = fVar1 * fVar26;
        }
        uVar20 = uVar20 + 1;
        lVar21 = lVar21 + 8;
      } while( true );
    }
    poVar9 = mesh->vertices;
    __s1 = poVar9 + uVar20;
    uVar12 = murmur_hash2_size4((uint32_t)__s1,(uint32_t *)0xc,(uint32_t)uVar17);
    iVar14 = 1;
    uVar17 = extraout_RDX_00;
    while( true ) {
      if (uVar16 - 1 < iVar14 - 1U) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_voxel_meshify.h"
                      ,0x19f,
                      "uint32_t *hash_table_find_vertex_position(uint32_t *, uint32_t, const ogt_mesh_vertex *, uint32_t)"
                     );
      }
      uVar19 = uVar12 & uVar16 - 1;
      uVar22 = (ulong)*(uint *)((long)pvVar15 + (ulong)uVar19 * 4);
      if (uVar22 == 0xffffffff) {
        *(int *)((long)pvVar15 + (ulong)uVar19 * 4) = (int)uVar20;
        iVar14 = iVar11;
        iVar11 = iVar11 + 1;
        goto LAB_0010ab14;
      }
      iVar13 = bcmp(__s1,poVar9 + uVar22,0xc);
      uVar17 = extraout_RDX_01;
      if (iVar13 == 0) break;
      uVar12 = uVar19 + iVar14;
      iVar14 = iVar14 + 1;
    }
    if (uVar20 <= uVar22) {
      __assert_fail("*existing_index < vertex_index",
                    "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_voxel_meshify.h"
                    ,0x198,
                    "uint32_t *hash_table_find_vertex_position(uint32_t *, uint32_t, const ogt_mesh_vertex *, uint32_t)"
                   );
    }
    iVar14 = *(int *)((long)__s + uVar22 * 4);
    if (iVar14 == -1) {
      __assert_fail("remap_indices[*hash_table_entry] != UINT32_MAX",
                    "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_voxel_meshify.h"
                    ,499,
                    "void ogt_mesh_smooth_normals(const ogt_voxel_meshify_context *, ogt_mesh *)");
    }
LAB_0010ab14:
    *(int *)((long)__s + uVar20 * 4) = iVar14;
    uVar20 = uVar20 + 1;
  } while( true );
}

Assistant:

void ogt_mesh_smooth_normals(const ogt_voxel_meshify_context* ctx, ogt_mesh* mesh) {
    // generate an remap table for vertex indices based on the vertex positions.
    uint32_t* remap_indices = (uint32_t*)_voxel_meshify_malloc(ctx, sizeof(uint32_t) * mesh->vertex_count);
    memset(remap_indices, -1, mesh->vertex_count * sizeof(uint32_t));
    {
        // allocate a hash table that is sized at the next power of 2 above the vertex count
        uint32_t hash_table_size = 1;
        while (hash_table_size < mesh->vertex_count)
            hash_table_size *= 2;
        uint32_t hash_table_mask = hash_table_size - 1;
        uint32_t* hash_table = (uint32_t*)_voxel_meshify_malloc(ctx, sizeof(uint32_t) * hash_table_size);
        memset(hash_table, -1, hash_table_size * sizeof(uint32_t));

        // create a unique mapping for each vertex based purely on its position
        uint32_t num_unique_vertices = 0;
        for (uint32_t vertex_index = 0; vertex_index < mesh->vertex_count; vertex_index++) {
            uint32_t* hash_table_entry = hash_table_find_vertex_position(hash_table, hash_table_mask, mesh->vertices, vertex_index);
            if (*hash_table_entry == UINT32_MAX) {
                // vertex is not already in the hash table. allocate a unique index for it.
                *hash_table_entry = vertex_index;
                remap_indices[vertex_index] = num_unique_vertices++;
            }
            else {
                // vertex is already in the hash table. Point this to the index that is already existing!
                assert(remap_indices[*hash_table_entry] != UINT32_MAX);
                remap_indices[vertex_index] = remap_indices[*hash_table_entry];
            }
        }
        // now that we have remap_indices, we no longer need the hash table. 
        _voxel_meshify_free(ctx, hash_table);
    }

    // for each triangle face, add the normal of the face to the unique normal for the vertex
    ogt_mesh_vec3* remap_normals = (ogt_mesh_vec3*)_voxel_meshify_malloc(ctx, sizeof(ogt_mesh_vec3) * mesh->vertex_count);
    memset(remap_normals, 0, sizeof(ogt_mesh_vec3) * mesh->vertex_count);

    for (uint32_t i = 0; i < mesh->index_count; i += 3) {
        uint32_t i0 = mesh->indices[i + 0];
        uint32_t i1 = mesh->indices[i + 1];
        uint32_t i2 = mesh->indices[i + 2];
        ogt_mesh_vertex v0 = mesh->vertices[i0];
        ogt_mesh_vertex v1 = mesh->vertices[i1];
        ogt_mesh_vertex v2 = mesh->vertices[i2];
        ogt_mesh_vec3 normal = _cross3(_sub3(v1.pos, v0.pos), _sub3(v2.pos, v0.pos));

        uint32_t ri0 = remap_indices[i0];
        uint32_t ri1 = remap_indices[i1];
        uint32_t ri2 = remap_indices[i2];
        remap_normals[ri0] = _add3(remap_normals[ri0], normal);
        remap_normals[ri1] = _add3(remap_normals[ri1], normal);
        remap_normals[ri2] = _add3(remap_normals[ri2], normal);
    }

    // for each vertex, copy over remap normal if it's non-zero.
    for (uint32_t vertex_index = 0; vertex_index < mesh->vertex_count; vertex_index++) {
        ogt_mesh_vec3 accumulated_normal = remap_normals[remap_indices[vertex_index]];
        if (_dot3(accumulated_normal, accumulated_normal) > 0.001f)
            mesh->vertices[vertex_index].normal = _normalize3(accumulated_normal);
    }

    _voxel_meshify_free(ctx, remap_normals);
    _voxel_meshify_free(ctx, remap_indices);
}